

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPTrap.h
# Opt level: O3

void __thiscall SNMPTrap::SNMPTrap(SNMPTrap *this,char *community,SNMP_VERSION version)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  OIDType *pOVar2;
  allocator local_51;
  string local_50;
  
  SNMPPacket::SNMPPacket(&this->super_SNMPPacket);
  (this->super_SNMPPacket)._vptr_SNMPPacket = (_func_int **)&PTR__SNMPTrap_001a1938;
  IPAddress::IPAddress(&this->agentIP);
  this->trapOID = (OIDType *)0x0;
  this->uptimeCallback = (TimestampCallback *)0x0;
  this->genericTrap = 6;
  this->specificTrap = 1;
  this->trapUDPport = 0xa2;
  this->inform = false;
  this->_udp = (UDP *)0x0;
  *(list<ValueCallback_*,_std::allocator<ValueCallback_*>_> **)&this->field_0x110 = &this->callbacks
  ;
  *(list<ValueCallback_*,_std::allocator<ValueCallback_*>_> **)&this->callbacks = &this->callbacks;
  *(undefined8 *)&this->field_0x118 = 0;
  pOVar2 = (OIDType *)operator_new(0x50);
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,".1.3.6.1.2.1.1.3.0","");
  OIDType::OIDType(pOVar2,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  this->timestampOID = pOVar2;
  pOVar2 = (OIDType *)operator_new(0x50);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,".1.3.6.1.2.1.1.2.0","");
  OIDType::OIDType(pOVar2,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  this->snmpTrapOID = pOVar2;
  SNMPPacket::setVersion(&this->super_SNMPPacket,version);
  SNMPPacket::setPDUType(&this->super_SNMPPacket,Trapv2PDU);
  std::__cxx11::string::string((string *)&local_50,community,&local_51);
  SNMPPacket::setCommunityString(&this->super_SNMPPacket,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

SNMPTrap(const char* community, SNMP_VERSION version){
        this->setVersion(version);
        // Version two will use the SNMPPacket builder which uses the member pduType
        // Version one will use special builder with hardcoded PDU Type
        this->setPDUType(Trapv2PDU);
        this->setCommunityString(community);
    }